

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O0

void lj_trace_stitch(jit_State *J,BCIns *pc)

{
  jit_State *in_RSI;
  long in_RDI;
  BCIns *in_stack_ffffffffffffffe8;
  
  if ((*(int *)(in_RDI + 0xd4) == 0) && ((*(byte *)(in_RDI + -0x13f) & 0x60) == 0)) {
    *(undefined4 *)(in_RDI + 0x9a8) = 0;
    *(undefined4 *)(in_RDI + 0xd4) = 0x12;
    lj_trace_ins(in_RSI,in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

void LJ_FASTCALL lj_trace_stitch(jit_State *J, const BCIns *pc)
{
  /* Only start a new trace if not recording or inside __gc call or vmevent. */
  if (J->state == LJ_TRACE_IDLE &&
      !(J2G(J)->hookmask & (HOOK_GC|HOOK_VMEVENT))) {
    J->parent = 0;  /* Have to treat it like a root trace. */
    /* J->exitno is set to the invoking trace. */
    J->state = LJ_TRACE_START;
    lj_trace_ins(J, pc);
  }
}